

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

void Psr_ManPrintModules(Psr_Man_t *p)

{
  Abc_Nam_t *pAVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  int local_1c;
  char *pcStack_18;
  int i;
  char *pName;
  Psr_Man_t *p_local;
  
  uVar2 = Vec_IntSize(&p->vSucceeded);
  printf("Succeeded parsing %d models:\n",(ulong)uVar2);
  local_1c = 0;
  while( true ) {
    iVar3 = Vec_IntSize(&p->vSucceeded);
    bVar4 = false;
    if (local_1c < iVar3) {
      pAVar1 = p->pStrs;
      iVar3 = Vec_IntEntry(&p->vSucceeded,local_1c);
      pcStack_18 = Abc_NamStr(pAVar1,iVar3);
      bVar4 = pcStack_18 != (char *)0x0;
    }
    if (!bVar4) break;
    printf(" %s",pcStack_18);
    local_1c = local_1c + 1;
  }
  printf("\n");
  uVar2 = Vec_IntSize(&p->vKnown);
  printf("Skipped %d known models:\n",(ulong)uVar2);
  local_1c = 0;
  while( true ) {
    iVar3 = Vec_IntSize(&p->vKnown);
    bVar4 = false;
    if (local_1c < iVar3) {
      pAVar1 = p->pStrs;
      iVar3 = Vec_IntEntry(&p->vKnown,local_1c);
      pcStack_18 = Abc_NamStr(pAVar1,iVar3);
      bVar4 = pcStack_18 != (char *)0x0;
    }
    if (!bVar4) break;
    printf(" %s",pcStack_18);
    local_1c = local_1c + 1;
  }
  printf("\n");
  uVar2 = Vec_IntSize(&p->vFailed);
  printf("Skipped %d failed models:\n",(ulong)uVar2);
  local_1c = 0;
  while( true ) {
    iVar3 = Vec_IntSize(&p->vFailed);
    bVar4 = false;
    if (local_1c < iVar3) {
      pAVar1 = p->pStrs;
      iVar3 = Vec_IntEntry(&p->vFailed,local_1c);
      pcStack_18 = Abc_NamStr(pAVar1,iVar3);
      bVar4 = pcStack_18 != (char *)0x0;
    }
    if (!bVar4) break;
    printf(" %s",pcStack_18);
    local_1c = local_1c + 1;
  }
  printf("\n");
  return;
}

Assistant:

void Psr_ManPrintModules( Psr_Man_t * p )
{
    char * pName; int i; 
    printf( "Succeeded parsing %d models:\n", Vec_IntSize(&p->vSucceeded) );
    Psr_ManForEachNameVec( &p->vSucceeded, p, pName, i )
        printf( " %s", pName );
    printf( "\n" );
    printf( "Skipped %d known models:\n", Vec_IntSize(&p->vKnown) );
    Psr_ManForEachNameVec( &p->vKnown, p, pName, i )
        printf( " %s", pName );
    printf( "\n" );
    printf( "Skipped %d failed models:\n", Vec_IntSize(&p->vFailed) );
    Psr_ManForEachNameVec( &p->vFailed, p, pName, i )
        printf( " %s", pName );
    printf( "\n" );
}